

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O1

Roaring64Map *
roaring::Roaring64Map::portableDeserializeFrozen(Roaring64Map *__return_storage_ptr__,char *buf)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  size_t sVar3;
  long lVar4;
  uint *puVar5;
  Roaring read_var;
  uint local_5c;
  roaring_bitmap_t local_58;
  
  p_Var1 = &(__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(__return_storage_ptr__->roarings)._M_t._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header =
       0;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->copyOnWrite = false;
  lVar4 = *(long *)buf;
  if (lVar4 != 0) {
    puVar5 = (uint *)(buf + 8);
    do {
      uVar2 = *puVar5;
      Roaring::portableDeserializeFrozen((Roaring *)&local_58,(char *)(puVar5 + 1));
      sVar3 = roaring_bitmap_portable_size_in_bytes(&local_58);
      local_5c = uVar2;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,roaring::Roaring>,std::_Select1st<std::pair<unsigned_int_const,roaring::Roaring>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
      ::_M_emplace_unique<unsigned_int_const&,roaring::Roaring>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,roaring::Roaring>,std::_Select1st<std::pair<unsigned_int_const,roaring::Roaring>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
                  *)__return_storage_ptr__,&local_5c,(Roaring *)&local_58);
      puVar5 = (uint *)((long)(puVar5 + 1) + sVar3);
      Roaring::~Roaring((Roaring *)&local_58);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

static const Roaring64Map portableDeserializeFrozen(const char *buf) {
        Roaring64Map result;
        // get map size
        uint64_t map_size;
        std::memcpy(&map_size, buf, sizeof(uint64_t));
        buf += sizeof(uint64_t);
        for (uint64_t lcv = 0; lcv < map_size; lcv++) {
            // get map key
            uint32_t key;
            std::memcpy(&key, buf, sizeof(uint32_t));
            buf += sizeof(uint32_t);
            // read map value Roaring
            Roaring read_var = Roaring::portableDeserializeFrozen(buf);
            // forward buffer past the last Roaring bitmap
            buf += read_var.getSizeInBytes(true);
            result.emplaceOrInsert(key, std::move(read_var));
        }
        return result;
    }